

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

SharedPtr __thiscall
deqp::gles31::Functional::anon_unknown_0::generateRandomVariableDefinition
          (anon_unknown_0 *this,Random *rnd,SharedPtr *parentStructure,DataType baseType,
          Layout *layout,bool allowUnsized)

{
  int iVar1;
  int iVar2;
  ArrayElement *pAVar3;
  Node *ptr;
  Variable *this_00;
  SharedPtrStateBase *extraout_RDX;
  float fVar4;
  SharedPtr SVar5;
  SharedPtr currentStructure;
  SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
  local_40;
  
  currentStructure.m_ptr = parentStructure->m_ptr;
  currentStructure.m_state = parentStructure->m_state;
  if (currentStructure.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (currentStructure.m_state)->strongRefCount = (currentStructure.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (currentStructure.m_state)->weakRefCount = (currentStructure.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  iVar1 = layout->binding;
  iVar2 = 4;
  while (iVar2 != 0) {
    if ((iVar2 != 4 || !allowUnsized) || (fVar4 = deRandom_getFloat(&rnd->m_rnd), 0.2 <= fVar4)) {
      fVar4 = deRandom_getFloat(&rnd->m_rnd);
      if (fVar4 < 0.3 &&
          (iVar1 == -1 && (baseType != TYPE_UINT_ATOMIC_COUNTER && 0xd < baseType - TYPE_IMAGE_2D)))
      {
        ptr = (Node *)operator_new(0x20);
        ResourceDefinition::StructMember::StructMember((StructMember *)ptr,&currentStructure);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        SharedPtr(&local_40,ptr);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        operator=(&currentStructure,&local_40);
      }
      else {
        fVar4 = deRandom_getFloat(&rnd->m_rnd);
        if (0.3 <= fVar4) break;
        pAVar3 = (ArrayElement *)operator_new(0x28);
        ResourceDefinition::ArrayElement::ArrayElement(pAVar3,&currentStructure,-1);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        SharedPtr(&local_40,(Node *)pAVar3);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        operator=(&currentStructure,&local_40);
      }
    }
    else {
      pAVar3 = (ArrayElement *)operator_new(0x28);
      ResourceDefinition::ArrayElement::ArrayElement(pAVar3,&currentStructure,-2);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&local_40,(Node *)pAVar3);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::operator=(&currentStructure,&local_40);
    }
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&local_40);
    iVar2 = iVar2 + -1;
  }
  this_00 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(this_00,&currentStructure,baseType);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)this,(Node *)this_00);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&currentStructure);
  SVar5.m_state = extraout_RDX;
  SVar5.m_ptr = (Node *)this;
  return SVar5;
}

Assistant:

static ResourceDefinition::Node::SharedPtr generateRandomVariableDefinition (de::Random&								rnd,
																			 const ResourceDefinition::Node::SharedPtr&	parentStructure,
																			 glu::DataType								baseType,
																			 const glu::Layout&							layout,
																			 bool										allowUnsized)
{
	const int							maxNesting			= 4;
	ResourceDefinition::Node::SharedPtr	currentStructure	= parentStructure;
	const bool							canBeInsideAStruct	= layout.binding == -1 && !isDataTypeLayoutQualified(baseType);

	for (int nestNdx = 0; nestNdx < maxNesting; ++nestNdx)
	{
		if (allowUnsized && nestNdx == 0 && rnd.getFloat() < 0.2)
			currentStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::ArrayElement(currentStructure, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
		else if (rnd.getFloat() < 0.3 && canBeInsideAStruct)
			currentStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::StructMember(currentStructure));
		else if (rnd.getFloat() < 0.3)
			currentStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::ArrayElement(currentStructure));
		else
			break;
	}

	return ResourceDefinition::Node::SharedPtr(new ResourceDefinition::Variable(currentStructure, baseType));
}